

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTools.cxx
# Opt level: O2

bool cmsys::SystemTools::GetEnv(char *key,string *result)

{
  char *pcVar1;
  
  pcVar1 = getenv(key);
  if (pcVar1 != (char *)0x0) {
    std::__cxx11::string::assign((char *)result);
  }
  return pcVar1 != (char *)0x0;
}

Assistant:

bool SystemTools::GetEnv(const char* key, std::string& result)
{
  const char* v = getenv(key);
  if(v)
    {
    result = v;
    return true;
    }
  else
    {
    return false;
    }
}